

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

Cut_Cut_t * Cut_NodeUnionCutsSeq(Cut_Man_t *p,Vec_Int_t *vNodes,int CutSetNum,int fFirst)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  __time_t pList;
  int iVar4;
  int iVar5;
  long lVar6;
  Cut_Cut_t *pCVar7;
  Cut_Cut_t *pCVar8;
  void **ppvVar9;
  Vec_Ptr_t *pVVar10;
  timespec *ptVar11;
  long lVar12;
  Cut_Cut_t *pCVar13;
  size_t __size;
  Cut_Cut_t *pCVar14;
  Cut_Cut_t *pHead;
  Cut_List_t Super;
  timespec local_120;
  long local_110;
  long local_108;
  Cut_List_t local_100;
  
  uVar1 = p->pParams->nVarsMax;
  iVar4 = clock_gettime(3,(timespec *)&local_100);
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_100.pHead[1]),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + (long)local_100.pHead[0] * -1000000;
  }
  local_100.pHead[1] = (Cut_Cut_t *)0x0;
  local_100.pHead[2] = (Cut_Cut_t *)0x0;
  local_100.pHead[3] = (Cut_Cut_t *)0x0;
  local_100.pHead[4] = (Cut_Cut_t *)0x0;
  local_100.pHead[5] = (Cut_Cut_t *)0x0;
  local_100.pHead[6] = (Cut_Cut_t *)0x0;
  local_100.pHead[7] = (Cut_Cut_t *)0x0;
  local_100.pHead[8] = (Cut_Cut_t *)0x0;
  local_100.pHead[9] = (Cut_Cut_t *)0x0;
  local_100.pHead[10] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xb] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xc] = (Cut_Cut_t *)0x0;
  lVar6 = 8;
  do {
    *(long *)((long)local_100.ppTail + lVar6) = (long)local_100.pHead + lVar6;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x68);
  if (vNodes->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *vNodes->pArray;
  p->nNodeCuts = 1;
  pCVar7 = Cut_NodeReadCutsOld(p,iVar4);
  p->pCompareOld = pCVar7;
  if (CutSetNum < 0) {
    pCVar7 = (Cut_Cut_t *)0x0;
  }
  else {
    pCVar7 = Cut_NodeReadCutsNew(p,iVar4);
  }
  p->pCompareNew = pCVar7;
  pCVar7 = Cut_NodeReadCutsOld(p,iVar4);
  if (pCVar7 == (Cut_Cut_t *)0x0) {
    pCVar7 = Cut_NodeReadCutsNew(p,iVar4);
  }
  local_108 = lVar12;
  if (pCVar7 == (Cut_Cut_t *)0x0) {
    __assert_fail("pTop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x331,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
  }
  p->vTemp->nSize = 0;
  if (0 < vNodes->nSize) {
    lVar12 = 1;
    lVar6 = 0;
    do {
      if (lVar6 == 0 && -1 < CutSetNum) {
        pCVar8 = Cut_NodeReadCutsTemp(p,CutSetNum);
        Cut_NodeWriteCutsTemp(p,CutSetNum,(Cut_Cut_t *)0x0);
      }
      else {
        iVar5 = vNodes->pArray[lVar6];
        pCVar8 = Cut_NodeReadCutsNew(p,iVar5);
        Cut_NodeWriteCutsNew(p,iVar5,(Cut_Cut_t *)0x0);
      }
      if (pCVar8 != (Cut_Cut_t *)0x0) {
        if (fFirst != 0) {
          pCVar14 = pCVar8->pNext;
          pCVar8->pNext = (Cut_Cut_t *)0x0;
          if (lVar6 == 0) {
            if (0xbfffffff < *(uint *)pCVar8 + 0xf0000000) {
LAB_004b0ae7:
              __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutList.h"
                            ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
            }
            *local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = pCVar8;
            local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = &pCVar8->pNext;
            pCVar8 = pCVar14;
          }
          else {
            Cut_CutRecycle(p,pCVar8);
            pCVar8 = pCVar14;
          }
        }
        if (pCVar8 != (Cut_Cut_t *)0x0) {
          pCVar14 = pCVar8->pNext;
          while (pCVar13 = pCVar14, *(uint *)pCVar8 >> 0x1c != uVar1) {
            if ((p->pParams->fFilter == 0) ||
               ((iVar5 = Cut_CutFilterOne(p,&local_100,pCVar8), iVar5 == 0 &&
                ((p->pParams->fSeq == 0 ||
                 (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
                   (iVar5 = Cut_CutFilterOld(p,p->pCompareOld,pCVar8), iVar5 == 0)) &&
                  ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
                   (iVar5 = Cut_CutFilterOld(p,p->pCompareNew,pCVar8), iVar5 == 0)))))))))) {
              uVar2 = *(uint *)pCVar8;
              *(uint *)pCVar8 = (uVar2 & 0xff7fffff) + ((*(uint *)pCVar7 ^ uVar2) & 0x400000) * 2;
              pCVar14 = pCVar8->pNext;
              pCVar8->pNext = (Cut_Cut_t *)0x0;
              if (0xbfffffff < uVar2 + 0xf0000000) goto LAB_004b0ae7;
              *local_100.ppTail[uVar2 >> 0x1c] = pCVar8;
              local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = &pCVar8->pNext;
              iVar5 = p->nNodeCuts + 1;
              p->nNodeCuts = iVar5;
              if (iVar5 == p->pParams->nKeepMax) {
                if (pCVar14 != (Cut_Cut_t *)0x0) {
                  for (pCVar7 = pCVar14->pNext; Cut_CutRecycle(p,pCVar14),
                      pCVar7 != (Cut_Cut_t *)0x0; pCVar7 = pCVar7->pNext) {
                    pCVar14 = pCVar7;
                  }
                }
                if ((int)lVar6 + 1 < vNodes->nSize) {
                  do {
                    Cut_NodeFreeCuts(p,vNodes->pArray[lVar12]);
                    lVar12 = lVar12 + 1;
                  } while ((int)lVar12 < vNodes->nSize);
                }
                pVVar10 = p->vTemp;
                if (0 < pVVar10->nSize) {
                  lVar12 = 0;
                  do {
                    pCVar7 = (Cut_Cut_t *)pVVar10->pArray[lVar12];
                    if (pCVar7 != (Cut_Cut_t *)0x0) {
                      for (pCVar8 = pCVar7->pNext; Cut_CutRecycle(p,pCVar7),
                          pCVar8 != (Cut_Cut_t *)0x0; pCVar8 = pCVar8->pNext) {
                        pCVar7 = pCVar8;
                      }
                    }
                    lVar12 = lVar12 + 1;
                    pVVar10 = p->vTemp;
                  } while (lVar12 < pVVar10->nSize);
                }
                goto LAB_004b09f9;
              }
            }
            if (pCVar13 == (Cut_Cut_t *)0x0) goto LAB_004b0745;
            pCVar14 = pCVar13->pNext;
            pCVar8 = pCVar13;
          }
          pVVar10 = p->vTemp;
          uVar2 = pVVar10->nCap;
          if (pVVar10->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar10->pArray,0x80);
              }
              pVVar10->pArray = ppvVar9;
              iVar5 = 0x10;
            }
            else {
              lVar3 = (ulong)uVar2 * 2;
              if ((int)lVar3 <= (int)uVar2) goto LAB_004b0733;
              __size = (ulong)uVar2 << 4;
              local_110 = lVar3;
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(__size);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar10->pArray,__size);
              }
              pVVar10->pArray = ppvVar9;
              iVar5 = (int)local_110;
            }
            pVVar10->nCap = iVar5;
          }
LAB_004b0733:
          iVar5 = pVVar10->nSize;
          pVVar10->nSize = iVar5 + 1;
          pVVar10->pArray[iVar5] = pCVar8;
        }
      }
LAB_004b0745:
      lVar6 = lVar6 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar6 < vNodes->nSize);
  }
  pVVar10 = p->vTemp;
  if (0 < pVVar10->nSize) {
    lVar12 = 1;
    lVar6 = 0;
    do {
      pCVar8 = (Cut_Cut_t *)pVVar10->pArray[lVar6];
      if (pCVar8 != (Cut_Cut_t *)0x0) {
        pCVar14 = pCVar8->pNext;
        while( true ) {
          pCVar13 = pCVar14;
          if ((p->pParams->fFilter == 0) ||
             ((iVar5 = Cut_CutFilterOne(p,&local_100,pCVar8), iVar5 == 0 &&
              ((p->pParams->fSeq == 0 ||
               (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
                 (iVar5 = Cut_CutFilterOld(p,p->pCompareOld,pCVar8), iVar5 == 0)) &&
                ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
                 (iVar5 = Cut_CutFilterOld(p,p->pCompareNew,pCVar8), iVar5 == 0)))))))))) {
            uVar1 = *(uint *)pCVar8;
            *(uint *)pCVar8 = (uVar1 & 0xff7fffff) + ((*(uint *)pCVar7 ^ uVar1) & 0x400000) * 2;
            pCVar14 = pCVar8->pNext;
            pCVar8->pNext = (Cut_Cut_t *)0x0;
            if (0xbfffffff < uVar1 + 0xf0000000) goto LAB_004b0ae7;
            *local_100.ppTail[uVar1 >> 0x1c] = pCVar8;
            local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = &pCVar8->pNext;
            iVar5 = p->nNodeCuts + 1;
            p->nNodeCuts = iVar5;
            if (iVar5 == p->pParams->nKeepMax) {
              if (pCVar14 != (Cut_Cut_t *)0x0) {
                for (pCVar7 = pCVar14->pNext; Cut_CutRecycle(p,pCVar14), pCVar7 != (Cut_Cut_t *)0x0;
                    pCVar7 = pCVar7->pNext) {
                  pCVar14 = pCVar7;
                }
              }
              pVVar10 = p->vTemp;
              if ((int)lVar6 + 1 < pVVar10->nSize) {
                do {
                  pCVar7 = (Cut_Cut_t *)pVVar10->pArray[lVar12];
                  if (pCVar7 != (Cut_Cut_t *)0x0) {
                    for (pCVar8 = pCVar7->pNext; Cut_CutRecycle(p,pCVar7),
                        pCVar8 != (Cut_Cut_t *)0x0; pCVar8 = pCVar8->pNext) {
                      pCVar7 = pCVar8;
                    }
                  }
                  lVar12 = lVar12 + 1;
                  pVVar10 = p->vTemp;
                } while ((int)lVar12 < pVVar10->nSize);
              }
              goto LAB_004b09f9;
            }
          }
          if (pCVar13 == (Cut_Cut_t *)0x0) break;
          pCVar14 = pCVar13->pNext;
          pCVar8 = pCVar13;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar10 = p->vTemp;
      lVar12 = lVar12 + 1;
    } while (lVar6 < pVVar10->nSize);
  }
LAB_004b09f9:
  lVar12 = local_108;
  ptVar11 = &local_120;
  local_120.tv_sec = 0;
  lVar6 = 1;
  do {
    if (local_100.pHead[lVar6] != (Cut_Cut_t *)0x0) {
      ptVar11->tv_sec = (__time_t)local_100.pHead[lVar6];
      ptVar11 = (timespec *)local_100.ppTail[lVar6];
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  ptVar11->tv_sec = 0;
  pList = local_120.tv_sec;
  if (CutSetNum < 0) {
    pCVar7 = Cut_NodeReadCutsNew(p,iVar4);
    if (pCVar7 != (Cut_Cut_t *)0x0) {
      __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x3b8,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
    }
    Cut_NodeWriteCutsNew(p,iVar4,(Cut_Cut_t *)pList);
  }
  else {
    pCVar7 = Cut_NodeReadCutsTemp(p,CutSetNum);
    if (pCVar7 != (Cut_Cut_t *)0x0) {
      __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x3b3,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
    }
    Cut_NodeWriteCutsTemp(p,CutSetNum,(Cut_Cut_t *)pList);
  }
  iVar4 = clock_gettime(3,&local_120);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_120.tv_nsec / 1000 + local_120.tv_sec * 1000000;
  }
  p->timeUnion = p->timeUnion + lVar6 + lVar12;
  return (Cut_Cut_t *)pList;
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCutsSeq( Cut_Man_t * p, Vec_Int_t * vNodes, int CutSetNum, int fFirst )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2, * pTop;
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Root );
    p->pCompareNew = (CutSetNum >= 0)? Cut_NodeReadCutsNew( p, Root ) : NULL;

    // get the topmost cut
    pTop = NULL;
    if ( (pTop = Cut_NodeReadCutsOld( p, Root )) == NULL )
        pTop = Cut_NodeReadCutsNew( p, Root );
    assert( pTop != NULL );

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        if ( i == 0 && CutSetNum >= 0 )
        {
            pList = Cut_NodeReadCutsTemp( p, CutSetNum );
            Cut_NodeWriteCutsTemp( p, CutSetNum, NULL );
        }
        else
        {
            pList = Cut_NodeReadCutsNew( p, Node );
            Cut_NodeWriteCutsNew( p, Node, NULL );
        }
        if ( pList == NULL )
            continue;

        // process the cuts
        if ( fFirst )
        {
            // remember the starting point
            pListStart = pList->pNext;
            pList->pNext = NULL;
            // save or recycle the elementary cut
            if ( i == 0 )
                Cut_ListAdd( pSuper, pList );
            else
                Cut_CutRecycle( p, pList );
        }
        else
            pListStart = pList;

        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart   = pCut->pNext;
            pCut->pNext  = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    pList = Cut_ListFinish( pSuper );

    // set the lists at the node
//    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
//    Cut_NodeWriteCutsNew( p, Root, pList );
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pList );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Root) == NULL );
        Cut_NodeWriteCutsNew( p, Root, pList );
    }

p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
//    if ( fFirst )
//        p->nNodes -= vNodes->nSize - 1;
    return pList;
}